

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,unsigned_long value)

{
  Nonnull<char_*> pcVar1;
  unsigned_long value_local;
  Arg *this_local;
  
  pcVar1 = numbers_internal::FastIntToBuffer(value,this->scratch_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->piece_,this->scratch_,(long)pcVar1 - (long)this->scratch_);
  return;
}

Assistant:

Arg(unsigned long value)  // NOLINT(*)
      : piece_(scratch_,
               static_cast<size_t>(
                   numbers_internal::FastIntToBuffer(value, scratch_) -
                   scratch_)) {}